

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmSetPropertyCommand::HandleSource(cmSetPropertyCommand *this,cmSourceFile *sf)

{
  char *value;
  
  if (this->Remove == false) {
    value = (this->PropertyValue)._M_dataplus._M_p;
  }
  else {
    value = (char *)0x0;
  }
  if (this->AppendMode == true) {
    cmSourceFile::AppendProperty(sf,&this->PropertyName,value,this->AppendAsString);
  }
  else {
    cmSourceFile::SetProperty(sf,&this->PropertyName,value);
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleSource(cmSourceFile* sf)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;
  const char* value = this->PropertyValue.c_str();
  if (this->Remove) {
    value = CM_NULLPTR;
  }

  if (this->AppendMode) {
    sf->AppendProperty(name, value, this->AppendAsString);
  } else {
    sf->SetProperty(name, value);
  }
  return true;
}